

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O0

RealType __thiscall OpenMD::ElementsTable::GetElectroNeg(ElementsTable *this,int atomicnum)

{
  size_type sVar1;
  reference ppEVar2;
  int in_ESI;
  byte *in_RDI;
  RealType RVar3;
  ElementsTable *in_stack_000080d0;
  
  if ((*in_RDI & 1) == 0) {
    Init(in_stack_000080d0);
  }
  if ((-1 < in_ESI) &&
     (sVar1 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::size
                        ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                         (in_RDI + 0x88)), in_ESI < (int)sVar1)) {
    ppEVar2 = std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::operator[]
                        ((vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_> *)
                         (in_RDI + 0x88),(long)in_ESI);
    RVar3 = Element::GetElectroNeg(*ppEVar2);
    return RVar3;
  }
  return 0.0;
}

Assistant:

RealType ElementsTable::GetElectroNeg(int atomicnum) {
    if (!init_) Init();

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size()))
      return (0.0);

    return (elements_[atomicnum]->GetElectroNeg());
  }